

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathFuncs.cpp
# Opt level: O0

void __thiscall
slang::ast::builtins::RealMath2Function<&hypot>::~RealMath2Function(RealMath2Function<&hypot> *this)

{
  void *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  ~RealMath2Function((RealMath2Function<&hypot> *)0x135f9a8);
  operator_delete(in_RDI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

RealMath2Function(const Builtins& builtins, KnownSystemName knownNameId) :
        SimpleSystemSubroutine(knownNameId, SubroutineKind::Function, 2,
                               {&builtins.realType, &builtins.realType}, builtins.realType, false) {
    }